

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X86DisassemblerDecoder.c
# Opt level: O0

int readOperands(InternalInstruction *insn)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  OperandSpecifier *op;
  InternalInstruction *in_RDI;
  int sawRegImm;
  int needVVVV;
  int hasVVVV;
  int index;
  undefined7 in_stack_ffffffffffffffd8;
  char cVar6;
  int local_4;
  
  bVar1 = false;
  iVar3 = readVVVV(in_RDI);
  uVar4 = (uint)((iVar3 != 0 ^ 0xffU) & 1);
  cVar6 = false;
  if (uVar4 != 0) {
    cVar6 = in_RDI->vvvv != MODRM_REG_AL;
  }
  iVar3 = 0;
  bVar2 = (bool)cVar6;
  do {
    if (5 < iVar3) {
      if (bVar2 == false) {
        local_4 = 0;
      }
      else {
        local_4 = -1;
      }
      return local_4;
    }
    op = (OperandSpecifier *)(ulong)x86OperandSets[in_RDI->spec->operands][iVar3].encoding;
    switch(op) {
    case (OperandSpecifier *)0x0:
    case (OperandSpecifier *)0x1e:
    case (OperandSpecifier *)0x1f:
      break;
    case (OperandSpecifier *)0x1:
    case (OperandSpecifier *)0x2:
    case (OperandSpecifier *)0x3:
    case (OperandSpecifier *)0x4:
    case (OperandSpecifier *)0x5:
    case (OperandSpecifier *)0x6:
    case (OperandSpecifier *)0x7:
    case (OperandSpecifier *)0x8:
      iVar5 = readModRM((InternalInstruction *)CONCAT44(iVar3,uVar4));
      if (iVar5 != 0) {
        return -1;
      }
      iVar5 = fixupReg((InternalInstruction *)CONCAT17(cVar6,in_stack_ffffffffffffffd8),op);
      if (iVar5 != 0) {
        return -1;
      }
      if ((x86OperandSets[in_RDI->spec->operands][iVar3].encoding != '\x01') &&
         (in_RDI->eaDisplacement == EA_DISP_8)) {
        in_RDI->displacement =
             (1L << (x86OperandSets[in_RDI->spec->operands][iVar3].encoding - 2 & 0x3f)) *
             in_RDI->displacement;
      }
      break;
    case (OperandSpecifier *)0x9:
      bVar2 = false;
      if (uVar4 == 0) {
        return -1;
      }
      iVar5 = fixupReg((InternalInstruction *)CONCAT17(cVar6,in_stack_ffffffffffffffd8),op);
      if (iVar5 != 0) {
        return -1;
      }
      break;
    case (OperandSpecifier *)0xa:
      iVar5 = readMaskRegister(in_RDI);
      if (iVar5 != 0) {
        return -1;
      }
      break;
    case (OperandSpecifier *)0xb:
    case (OperandSpecifier *)0xc:
    case (OperandSpecifier *)0xd:
    case (OperandSpecifier *)0xe:
    case (OperandSpecifier *)0xf:
    case (OperandSpecifier *)0x10:
      return -1;
    case (OperandSpecifier *)0x11:
      if (bVar1) {
        in_RDI->immediates[in_RDI->numImmediatesConsumed] =
             in_RDI->immediates[(int)(in_RDI->numImmediatesConsumed - 1)] & 0xf;
        in_RDI->numImmediatesConsumed = in_RDI->numImmediatesConsumed + '\x01';
      }
      else {
        iVar5 = readImmediate((InternalInstruction *)CONCAT17(cVar6,in_stack_ffffffffffffffd8),'\0')
        ;
        if (iVar5 != 0) {
          return -1;
        }
        if ((*(char *)((ulong)in_RDI->spec->operands * 0xc + 0x633341 + (long)iVar3 * 2) == '8') ||
           (*(char *)((ulong)in_RDI->spec->operands * 0xc + 0x633341 + (long)iVar3 * 2) == '9')) {
          bVar1 = true;
        }
      }
      break;
    case (OperandSpecifier *)0x12:
      iVar5 = readImmediate((InternalInstruction *)CONCAT17(cVar6,in_stack_ffffffffffffffd8),'\0');
      if (iVar5 != 0) {
        return -1;
      }
      break;
    case (OperandSpecifier *)0x13:
      iVar5 = readImmediate((InternalInstruction *)CONCAT17(cVar6,in_stack_ffffffffffffffd8),'\0');
      if (iVar5 != 0) {
        return -1;
      }
      break;
    case (OperandSpecifier *)0x14:
      iVar5 = readImmediate((InternalInstruction *)CONCAT17(cVar6,in_stack_ffffffffffffffd8),'\0');
      if (iVar5 != 0) {
        return -1;
      }
      break;
    case (OperandSpecifier *)0x15:
      iVar5 = readOpcodeRegister(in_RDI,'\x01');
      if (iVar5 != 0) {
        return -1;
      }
      break;
    case (OperandSpecifier *)0x16:
      iVar5 = readOpcodeRegister(in_RDI,'\x02');
      if (iVar5 != 0) {
        return -1;
      }
      break;
    case (OperandSpecifier *)0x17:
      iVar5 = readOpcodeRegister(in_RDI,'\x04');
      if (iVar5 != 0) {
        return -1;
      }
      break;
    case (OperandSpecifier *)0x18:
      iVar5 = readOpcodeRegister(in_RDI,'\b');
      if (iVar5 != 0) {
        return -1;
      }
      break;
    case (OperandSpecifier *)0x19:
      break;
    case (OperandSpecifier *)0x1a:
      iVar5 = readImmediate((InternalInstruction *)CONCAT17(cVar6,in_stack_ffffffffffffffd8),'\0');
      if (iVar5 != 0) {
        return -1;
      }
      break;
    case (OperandSpecifier *)0x1b:
      iVar5 = readImmediate((InternalInstruction *)CONCAT17(cVar6,in_stack_ffffffffffffffd8),'\0');
      if (iVar5 != 0) {
        return -1;
      }
      in_RDI->displacementOffset = in_RDI->immediateOffset;
      in_RDI->consumedDisplacement = true;
      in_RDI->displacementSize = in_RDI->immediateSize;
      in_RDI->displacement = in_RDI->immediates[(int)(in_RDI->numImmediatesConsumed - 1)];
      in_RDI->immediateOffset = '\0';
      in_RDI->immediateSize = '\0';
      break;
    case (OperandSpecifier *)0x1c:
      iVar5 = readOpcodeRegister(in_RDI,'\0');
      if (iVar5 != 0) {
        return -1;
      }
      break;
    case (OperandSpecifier *)0x1d:
      break;
    default:
      return -1;
    }
    iVar3 = iVar3 + 1;
  } while( true );
}

Assistant:

static int readOperands(struct InternalInstruction *insn)
{
	int index;
	int hasVVVV, needVVVV;
	int sawRegImm = 0;

	// printf(">>> readOperands(): ID = %u\n", insn->instructionID);
	/* If non-zero vvvv specified, need to make sure one of the operands
	   uses it. */
	hasVVVV = !readVVVV(insn);
	needVVVV = hasVVVV && (insn->vvvv != 0);

	for (index = 0; index < X86_MAX_OPERANDS; ++index) {
		//printf(">>> encoding[%u] = %u\n", index, x86OperandSets[insn->spec->operands][index].encoding);
		switch (x86OperandSets[insn->spec->operands][index].encoding) {
			case ENCODING_NONE:
			case ENCODING_SI:
			case ENCODING_DI:
				break;
			case ENCODING_REG:
			CASE_ENCODING_RM:
				if (readModRM(insn))
					return -1;
				if (fixupReg(insn, &x86OperandSets[insn->spec->operands][index]))
					return -1;
				// Apply the AVX512 compressed displacement scaling factor.
				if (x86OperandSets[insn->spec->operands][index].encoding != ENCODING_REG && insn->eaDisplacement == EA_DISP_8)
					insn->displacement *= (int64_t)1 << (x86OperandSets[insn->spec->operands][index].encoding - ENCODING_RM);
				break;
			case ENCODING_CB:
			case ENCODING_CW:
			case ENCODING_CD:
			case ENCODING_CP:
			case ENCODING_CO:
			case ENCODING_CT:
				// dbgprintf(insn, "We currently don't hande code-offset encodings");
				return -1;
			case ENCODING_IB:
				if (sawRegImm) {
					/* Saw a register immediate so don't read again and instead split the
					   previous immediate.  FIXME: This is a hack. */
					insn->immediates[insn->numImmediatesConsumed] =
						insn->immediates[insn->numImmediatesConsumed - 1] & 0xf;
					++insn->numImmediatesConsumed;
					break;
				}
				if (readImmediate(insn, 1))
					return -1;
				if (x86OperandSets[insn->spec->operands][index].type == TYPE_XMM128 ||
						x86OperandSets[insn->spec->operands][index].type == TYPE_XMM256)
					sawRegImm = 1;
				break;
			case ENCODING_IW:
				if (readImmediate(insn, 2))
					return -1;
				break;
			case ENCODING_ID:
				if (readImmediate(insn, 4))
					return -1;
				break;
			case ENCODING_IO:
				if (readImmediate(insn, 8))
					return -1;
				break;
			case ENCODING_Iv:
				if (readImmediate(insn, insn->immediateSize))
					return -1;
				break;
			case ENCODING_Ia:
				if (readImmediate(insn, insn->addressSize))
					return -1;
				/* Direct memory-offset (moffset) immediate will get mapped
				   to memory operand later. We want the encoding info to
				   reflect that as well. */
				insn->displacementOffset = insn->immediateOffset;
				insn->consumedDisplacement = true;
				insn->displacementSize = insn->immediateSize;
				insn->displacement = insn->immediates[insn->numImmediatesConsumed - 1];
				insn->immediateOffset = 0;
				insn->immediateSize = 0;
				break;
			case ENCODING_RB:
				if (readOpcodeRegister(insn, 1))
					return -1;
				break;
			case ENCODING_RW:
				if (readOpcodeRegister(insn, 2))
					return -1;
				break;
			case ENCODING_RD:
				if (readOpcodeRegister(insn, 4))
					return -1;
				break;
			case ENCODING_RO:
				if (readOpcodeRegister(insn, 8))
					return -1;
				break;
			case ENCODING_Rv:
				if (readOpcodeRegister(insn, 0))
					return -1;
				break;
			case ENCODING_FP:
				break;
			case ENCODING_VVVV:
				needVVVV = 0; /* Mark that we have found a VVVV operand. */
				if (!hasVVVV)
					return -1;
				if (fixupReg(insn, &x86OperandSets[insn->spec->operands][index]))
					return -1;
				break;
			case ENCODING_WRITEMASK:
				if (readMaskRegister(insn))
					return -1;
				break;
			case ENCODING_DUP:
				break;
			default:
				// dbgprintf(insn, "Encountered an operand with an unknown encoding.");
				return -1;
		}
	}

	/* If we didn't find ENCODING_VVVV operand, but non-zero vvvv present, fail */
	if (needVVVV) return -1;

	return 0;
}